

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O0

void Dsd_TreeGetInfo_rec(Dsd_Node_t *pNode,int RankCur)

{
  int local_1c;
  int local_18;
  int GateSize;
  int i;
  int RankCur_local;
  Dsd_Node_t *pNode_local;
  
  if (pNode == (Dsd_Node_t *)0x0) {
    __assert_fail("pNode",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/dsd/dsdTree.c"
                  ,0xd9,"void Dsd_TreeGetInfo_rec(Dsd_Node_t *, int)");
  }
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Dsd_IsComplement( pNode )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/dsd/dsdTree.c"
                  ,0xda,"void Dsd_TreeGetInfo_rec(Dsd_Node_t *, int)");
  }
  if (pNode->nVisits < 0) {
    __assert_fail("pNode->nVisits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/dsd/dsdTree.c"
                  ,0xdb,"void Dsd_TreeGetInfo_rec(Dsd_Node_t *, int)");
  }
  if ((pNode->Type == DSD_NODE_OR) || (pNode->Type == DSD_NODE_EXOR)) {
    local_1c = 2;
  }
  else {
    local_1c = (int)pNode->nDecs;
  }
  if (s_GateSizeMax < local_1c) {
    s_GateSizeMax = local_1c;
  }
  if (1 < pNode->nDecs) {
    if (s_DepthMax < RankCur + 1) {
      s_DepthMax = RankCur + 1;
    }
    for (local_18 = 0; local_18 < pNode->nDecs; local_18 = local_18 + 1) {
      Dsd_TreeGetInfo_rec((Dsd_Node_t *)((ulong)pNode->pDecs[local_18] & 0xfffffffffffffffe),
                          RankCur + 1);
    }
  }
  return;
}

Assistant:

void Dsd_TreeGetInfo_rec( Dsd_Node_t * pNode, int RankCur )
{
    int i;
    int GateSize;

    assert( pNode );
    assert( !Dsd_IsComplement( pNode ) );
    assert( pNode->nVisits >= 0 );

    // we don't want the two-input gates to count for non-decomposable blocks
    if ( pNode->Type == DSD_NODE_OR  || 
         pNode->Type == DSD_NODE_EXOR )
        GateSize = 2;
    else
        GateSize = pNode->nDecs;

    // update the max size of the node
    if ( s_GateSizeMax < GateSize )
         s_GateSizeMax = GateSize;

    if ( pNode->nDecs < 2 )
        return;

    // update the max rank
    if ( s_DepthMax < RankCur+1 )
         s_DepthMax = RankCur+1;

    // call recursively
    for ( i = 0; i < pNode->nDecs; i++ )
        Dsd_TreeGetInfo_rec( Dsd_Regular(pNode->pDecs[i]), RankCur+1 );
}